

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

ScenarioLowerBound * __thiscall
despot::Adventurer::CreateScenarioLowerBound
          (Adventurer *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  TrivialParticleLowerBound *this_00;
  AdventurerSmartPolicy *this_01;
  ParticleLowerBound *pPVar2;
  ostream *poVar3;
  string *this_02;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (TrivialParticleLowerBound *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound(this_00,(DSPOMDP *)this);
    return (ScenarioLowerBound *)this_00;
  }
  bVar1 = std::operator==(name,"STAY");
  if ((bVar1) || (bVar1 = std::operator==(name,"DEFAULT"), bVar1)) {
    this_01 = (AdventurerSmartPolicy *)operator_new(0x28);
    std::__cxx11::string::string(local_40,(string *)particle_bound_name);
    this_02 = local_40;
    pPVar2 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,this_02);
    despot::BlindPolicy::BlindPolicy((BlindPolicy *)this_01,(DSPOMDP *)this,0,pPVar2);
  }
  else {
    bVar1 = std::operator==(name,"SMART");
    if (bVar1) {
      this_01 = (AdventurerSmartPolicy *)operator_new(0x28);
      std::__cxx11::string::string(local_60,(string *)particle_bound_name);
      this_02 = local_60;
      pPVar2 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,this_02);
      AdventurerSmartPolicy::AdventurerSmartPolicy(this_01,(DSPOMDP *)this,pPVar2);
    }
    else {
      bVar1 = std::operator==(name,"RANDOM");
      if (bVar1) {
        this_01 = (AdventurerSmartPolicy *)operator_new(0x38);
        std::__cxx11::string::string(local_80,(string *)particle_bound_name);
        this_02 = local_80;
        pPVar2 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,this_02);
        despot::RandomPolicy::RandomPolicy((RandomPolicy *)this_01,(DSPOMDP *)this,pPVar2);
      }
      else {
        bVar1 = std::operator==(name,"MODE");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"MDP",&local_101);
          ComputeDefaultActions(this,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          this_01 = (AdventurerSmartPolicy *)operator_new(0x48);
          std::__cxx11::string::string(local_a0,(string *)particle_bound_name);
          this_02 = local_a0;
          pPVar2 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,this_02);
          despot::ModeStatePolicy::ModeStatePolicy
                    ((ModeStatePolicy *)this_01,(DSPOMDP *)this,&this->super_StateIndexer,
                     &this->super_StatePolicy,pPVar2);
        }
        else {
          bVar1 = std::operator==(name,"MAJORITY");
          if (!bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario lower bound: ");
            poVar3 = std::operator<<(poVar3,(string *)name);
            std::endl<char,std::char_traits<char>>(poVar3);
            exit(-1);
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"MDP",&local_101);
          ComputeDefaultActions(this,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          this_01 = (AdventurerSmartPolicy *)operator_new(0x28);
          std::__cxx11::string::string(local_c0,(string *)particle_bound_name);
          this_02 = local_c0;
          pPVar2 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,this_02);
          despot::MajorityActionPolicy::MajorityActionPolicy
                    ((MajorityActionPolicy *)this_01,(DSPOMDP *)this,&this->super_StatePolicy,pPVar2
                    );
        }
      }
    }
  }
  std::__cxx11::string::~string(this_02);
  return (ScenarioLowerBound *)this_01;
}

Assistant:

ScenarioLowerBound* Adventurer::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "STAY" || name == "DEFAULT") {
		return new BlindPolicy(model, A_STAY,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "SMART") {
		return new AdventurerSmartPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE") {
		const_cast<Adventurer*>(this)->ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY") {
		// ComputeDefaultActions(Globals::config.default_action);
		const_cast<Adventurer*>(this)->ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario lower bound: " << name << endl;
		exit(-1);
		return NULL;
	}
}